

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character-generator.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  Character *pCVar1;
  undefined8 uVar2;
  byte local_152;
  byte local_151;
  Skills *local_150;
  CharacterClass *local_140;
  undefined4 local_134;
  AbilityScores *local_130;
  Race *local_120;
  byte local_112;
  string local_110 [39];
  byte local_e9;
  string local_e8 [39];
  undefined1 local_c1;
  string local_c0 [38];
  byte local_9a;
  allocator local_99;
  string local_98 [8];
  string name;
  bool equipment;
  bool hp;
  Skills *skills;
  CharacterClass *charClass;
  uint bg;
  AbilityScores *scores;
  Race *race;
  Character *pCStack_20;
  int status;
  Character *character;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  pCStack_20 = (Character *)0x0;
  character = (Character *)argv;
  argv_local._0_4_ = argc;
  race._4_4_ = parse_args(argc,argv,&stack0xffffffffffffffe0);
  if (pCStack_20 == (Character *)0x0) {
    if ((RANDOM_FLAG & 1U) == 0) {
      local_112 = ORPG::Characters::request_is_random();
    }
    else {
      local_112 = RANDOM_FLAG;
    }
    RANDOM_FLAG = (bool)(local_112 & 1);
    if (RANDOM_FLAG == false) {
      local_120 = (Race *)ORPG::Characters::request_race();
    }
    else {
      local_120 = ORPG::Characters::new_random_race();
    }
    if ((RANDOM_FLAG & 1U) == 0) {
      local_130 = (AbilityScores *)ORPG::Characters::request_scores();
    }
    else {
      local_130 = (AbilityScores *)operator_new(0x38);
      ORPG::AbilityScores::AbilityScores(local_130,'\0');
    }
    if ((RANDOM_FLAG & 1U) == 0) {
      local_134 = ORPG::Characters::request_background();
    }
    else {
      local_134 = ORPG::Characters::random_bg_id();
    }
    if ((RANDOM_FLAG & 1U) == 0) {
      local_140 = (CharacterClass *)ORPG::Characters::request_class();
    }
    else {
      local_140 = ORPG::Characters::new_random_character_class();
    }
    if ((RANDOM_FLAG & 1U) == 0) {
      local_150 = (Skills *)ORPG::Characters::request_skills();
    }
    else {
      local_150 = (Skills *)operator_new(0x38);
      ORPG::Skills::Skills(local_150);
    }
    if ((RANDOM_FLAG & 1U) == 0) {
      local_151 = ORPG::Characters::request_hitpoints(local_140);
    }
    else {
      local_151 = 1;
    }
    if ((RANDOM_FLAG & 1U) == 0) {
      local_152 = ORPG::Characters::request_equipment();
    }
    else {
      local_152 = 1;
    }
    local_9a = 0;
    if ((RANDOM_FLAG & 1U) == 0) {
      ORPG::Characters::request_name_abi_cxx11_();
    }
    else {
      std::allocator<char>::allocator();
      local_9a = 1;
      std::__cxx11::string::string(local_98,"",&local_99);
    }
    if ((local_9a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
    }
    pCVar1 = (Character *)operator_new(0xc0);
    local_c1 = 1;
    std::__cxx11::string::string(local_c0,local_98);
    ORPG::Character::Character(pCVar1,local_120,local_130,local_140,local_134,local_150,local_c0);
    local_c1 = 0;
    pCStack_20 = pCVar1;
    std::__cxx11::string::~string(local_c0);
    if (((local_151 & 1) == 0) && ((local_152 & 1) == 0)) {
      race._4_4_ = 1;
    }
    std::__cxx11::string::~string(local_98);
  }
  if (race._4_4_ != 1) {
    local_e9 = 0;
    if ((SHEET_FLAG & 1U) == 0) {
      ORPG::Character::to_string_abi_cxx11_();
      uVar2 = std::__cxx11::string::c_str();
      printf("%s",uVar2);
      std::__cxx11::string::~string(local_110);
    }
    else {
      ORPG::Character::to_ascii_sheet_abi_cxx11_();
      local_e9 = 1;
      uVar2 = std::__cxx11::string::c_str();
      printf("%s",uVar2);
    }
    if ((local_e9 & 1) != 0) {
      std::__cxx11::string::~string(local_e8);
    }
  }
  return race._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {
    Character* character = nullptr;
    
    int status = parse_args(argc, argv, character); // may exit

    if(character == nullptr) {
        /* begin creating the character here */
        RANDOM_FLAG = RANDOM_FLAG ? RANDOM_FLAG : request_is_random();

        auto race       = RANDOM_FLAG ? new_random_race() : request_race();
        //TODO(incomingstick): randomly generate ability scores, not an empty set
        auto scores     = RANDOM_FLAG ? new AbilityScores : request_scores();
        auto bg         = RANDOM_FLAG ? random_bg_id() : request_background();
        auto charClass  = RANDOM_FLAG ? new_random_character_class() : request_class();
        auto skills     = RANDOM_FLAG ? new Skills : request_skills();
        auto hp         = RANDOM_FLAG ? true : request_hitpoints(charClass);
        auto equipment  = RANDOM_FLAG ? true : request_equipment();
        auto name       = RANDOM_FLAG ? "" : request_name();

        /* IMPORTANT(incomingstick): If this is not a pointer, it will segfault during GC... idk why */
        character = new Character(race, scores, charClass, bg, skills, name);

        if(!hp && !equipment) {
            status = EXIT_FAILURE;
        }
    }

    if(status != EXIT_FAILURE) {
        SHEET_FLAG ? 
            printf("%s", character->to_ascii_sheet().c_str()) :
            printf("%s", character->to_string().c_str());
    }

    return status;
}